

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cpp
# Opt level: O0

Bond_p indigox::CreateBond(void)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RDI;
  Bond_p BVar1;
  Bond *in_stack_00000030;
  Bond *in_stack_ffffffffffffffc8;
  element_type *this;
  
  this = in_RDI;
  operator_new(0x58);
  Bond::Bond(in_stack_00000030);
  std::shared_ptr<indigox::Bond>::shared_ptr<indigox::Bond,void>
            ((shared_ptr<indigox::Bond> *)this,in_stack_ffffffffffffffc8);
  BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (Bond_p)BVar1.super___shared_ptr<indigox::Bond,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Bond_p CreateBond() { return Bond_p(new Bond()); }